

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

Write<int> __thiscall Omega_h::unmap<int>(Omega_h *this,LOs *a2b,Read<int> *b_data,Int width)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  int n;
  size_t sVar2;
  Write<int> WVar3;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_c1;
  type f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,&local_c1);
  std::operator+(&local_88,&local_48,":");
  std::__cxx11::to_string(&local_68,0x4c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,&local_88,
                 &local_68);
  begin_code("unmap",(char *)f.a2b.write_.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  pAVar1 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&f,"",(allocator *)&local_88);
  n = (int)(sVar2 >> 2);
  Write<int>::Write((Write<int> *)this,n * width,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<int>::Write((Write<int> *)&f,&a2b->write_);
  f.width = width;
  Write<int>::Write((Write<int> *)&f.a_data,(Write<int> *)this);
  Write<int>::Write((Write<int> *)&f.b_data,&b_data->write_);
  parallel_for<Omega_h::unmap<int>(Omega_h::Read<int>,Omega_h::Read<int>,int)::_lambda(int)_1_>
            (n,&f);
  unmap<int>(Omega_h::Read<int>,Omega_h::Read<int>,int)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)&f);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  WVar3.shared_alloc_.direct_ptr = extraout_RDX;
  WVar3.shared_alloc_.alloc = (Alloc *)this;
  return (Write<int>)WVar3.shared_alloc_;
}

Assistant:

Write<T> unmap(LOs a2b, Read<T> b_data, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto na = a2b.size();
  Write<T> a_data(na * width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    for (Int j = 0; j < width; ++j) {
      a_data[a * width + j] = b_data[b * width + j];
    }
  };
  parallel_for(na, std::move(f));
  return a_data;
}